

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O1

HaF64 Determinant2x2(HaF64 (*matrix) [2],HaF64 *error)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  dVar1 = (double)(*matrix)[0] * (double)matrix[1][1];
  dVar2 = (double)(*matrix)[1] * (double)matrix[1][0];
  auVar9._0_8_ = -dVar1;
  auVar9._8_8_ = 0x8000000000000000;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  uVar3 = vcmpsd_avx512f(auVar9,auVar6,2);
  bVar4 = (bool)((byte)uVar3 & 1);
  auVar8._0_8_ = -dVar2;
  auVar8._8_8_ = 0x8000000000000000;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  uVar3 = vcmpsd_avx512f(auVar8,auVar7,2);
  bVar5 = (bool)((byte)uVar3 & 1);
  *error = (HaF64)((double)((ulong)bVar4 * (long)dVar1 + (ulong)!bVar4 * (long)auVar9._0_8_) +
                  (double)((ulong)bVar5 * (long)dVar2 + (ulong)!bVar5 * (long)auVar8._0_8_));
  return (HaF64)(dVar1 - dVar2);
}

Assistant:

hacd::HaF64 Determinant2x2 (const hacd::HaF64 matrix[2][2], hacd::HaF64* const error)
{
	hacd::HaF64 a00xa11 = matrix[0][0] * matrix[1][1];
	hacd::HaF64 a01xa10 = matrix[0][1] * matrix[1][0];
	*error = Absolute(a00xa11) + Absolute(a01xa10);
	return a00xa11 - a01xa10;
}